

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O2

int factorf(int M)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = (ulong)(uint)M;
  do {
    uVar3 = uVar1;
    iVar2 = (int)uVar3;
    uVar1 = (long)iVar2 / 7;
  } while (iVar2 % 7 == 0);
  do {
    uVar1 = uVar3;
    uVar3 = (long)(int)uVar1 / 3;
  } while ((int)uVar1 % 3 == 0);
  do {
    uVar3 = uVar1 & 0xffffffff;
    iVar2 = (int)uVar1;
    uVar1 = (long)iVar2 / 5;
  } while (iVar2 % 5 == 0);
  do {
    iVar2 = (int)uVar3;
    uVar1 = uVar3 & 1;
    uVar3 = (ulong)(uint)(iVar2 >> 1);
  } while (uVar1 == 0);
  return iVar2;
}

Assistant:

int factorf(int M) {
	int N;
	N = M;
	while (N%7 == 0){
			N = N/7;
		}
	while (N%3 == 0){
			N = N/3;
		}
	while (N%5 == 0){
			N = N/5;
		}
	while (N%2 == 0){
			N = N/2;
		}

	return N;
}